

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void clask::serve_file(response_writer *resp,request *req,string *path)

{
  wchar_t *pwVar1;
  pointer pcVar2;
  pointer ppVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  iterator iVar7;
  ulong __val;
  long lVar8;
  long lVar9;
  long lVar10;
  tm *__tp;
  time_t tVar11;
  time_t tVar12;
  int iVar13;
  ulong uVar14;
  char cVar15;
  pointer ppVar16;
  _Put_time<char> __f;
  undefined1 auVar17 [16];
  time_t tt;
  path fspath;
  wstring wpath;
  stringstream date;
  ifstream is;
  char buf [8192];
  string local_24d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_24b8;
  key_type local_24b0;
  string local_2490;
  string local_2470;
  string local_2450;
  string local_2430;
  path local_2410;
  wstring local_23e8;
  undefined1 local_23c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_23b8 [7];
  ios_base local_2348 [264];
  long local_2240 [4];
  byte abStack_2220 [488];
  undefined1 local_2038 [32];
  undefined8 local_2018;
  long lStack_2010;
  char *local_2008;
  
  to_wstring(&local_23e8,path);
  local_2038._0_8_ = local_23e8._M_dataplus._M_p;
  std::filesystem::__cxx11::path::path<wchar_t_const*,std::filesystem::__cxx11::path>
            (&local_2410,(wchar_t **)local_2038,auto_format);
  std::ifstream::ifstream(local_2240,local_2410._M_pathname._M_dataplus._M_p,_S_in|_S_bin);
  if ((abStack_2220[*(long *)(local_2240[0] + -0x18)] & 5) == 0) {
    auVar17 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar17._8_8_ == -1 || auVar17._0_8_ == 0) {
      std::filesystem::__cxx11::path::path((path *)local_2038);
    }
    else {
      std::__cxx11::string::substr((ulong)local_23c8,auVar17._0_8_);
      std::filesystem::__cxx11::path::path((path *)local_2038,(string_type *)local_23c8,auto_format)
      ;
      if ((undefined1 *)local_23c8._0_8_ != local_23c8 + 0x10) {
        operator_delete((void *)local_23c8._0_8_,local_23b8[0]._M_allocated_capacity + 1);
      }
    }
    local_24b0._M_dataplus._M_p = (pointer)&local_24b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_24b0,local_2038._0_8_,(pointer)(local_2038._0_8_ + local_2038._8_8_)
              );
    iVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)content_types_abi_cxx11_,&local_24b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_24b0._M_dataplus._M_p != &local_24b0.field_2) {
      operator_delete(local_24b0._M_dataplus._M_p,local_24b0.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_2038);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_2450._M_dataplus._M_p = (pointer)&local_2450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2450,"content-type","");
      response_writer::set_header
                (resp,&local_2450,
                 (string *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2450._M_dataplus._M_p != &local_2450.field_2) {
        operator_delete(local_2450._M_dataplus._M_p,local_2450.field_2._M_allocated_capacity + 1);
      }
    }
    __val = std::filesystem::file_size(&local_2410);
    local_2470._M_dataplus._M_p = (pointer)&local_2470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2470,"content-length","");
    cVar15 = '\x01';
    if (9 < __val) {
      uVar14 = __val;
      cVar5 = '\x04';
      do {
        cVar15 = cVar5;
        if (uVar14 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0010b1ed;
        }
        if (uVar14 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0010b1ed;
        }
        if (uVar14 < 10000) goto LAB_0010b1ed;
        bVar4 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        cVar5 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_0010b1ed:
    local_2038._0_8_ = local_2038 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_2038,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_2038._0_8_,local_2038._8_4_,__val);
    response_writer::set_header(resp,&local_2470,(string *)local_2038);
    if ((undefined1 *)local_2038._0_8_ != local_2038 + 0x10) {
      operator_delete((void *)local_2038._0_8_,local_2038._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2470._M_dataplus._M_p != &local_2470.field_2) {
      operator_delete(local_2470._M_dataplus._M_p,local_2470.field_2._M_allocated_capacity + 1);
    }
    lVar8 = std::filesystem::last_write_time(&local_2410);
    lVar9 = std::chrono::_V2::system_clock::now();
    lVar10 = std::chrono::_V2::system_clock::now();
    local_24b0._M_dataplus._M_p =
         (pointer)((lVar10 + 0x59572d4cbf520000 + (lVar8 - lVar9)) / 1000000000);
    __tp = gmtime((time_t *)&local_24b0);
    ppVar16 = (req->headers).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (req->headers).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar16 != ppVar3) {
      local_24b8 = &resp->headers;
      pcVar2 = local_23c8 + 0x10;
      do {
        iVar6 = std::__cxx11::string::compare((char *)ppVar16);
        iVar13 = 0;
        if (iVar6 == 0) {
          local_2018._0_4_ = 0;
          local_2018._4_4_ = 0;
          lStack_2010 = 0;
          local_2038._16_8_ = 0;
          local_2038._24_8_ = 0;
          local_2038._0_8_ = (wchar_t *)0x0;
          local_2038._8_8_ = 0;
          local_2008 = (char *)0x0;
          tVar11 = mktime((tm *)local_2038);
          tVar12 = mktime(__tp);
          iVar13 = 2;
          if (tVar11 <= tVar12) {
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_M_erase_at_end(local_24b8,
                              (resp->headers).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            resp->code = 0x130;
            local_24d8._M_dataplus._M_p = (pointer)&local_24d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_24d8,"content-type","")
            ;
            local_23c8._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_23c8,"text/plain","");
            response_writer::set_header(resp,&local_24d8,(string *)local_23c8);
            if ((pointer)local_23c8._0_8_ != pcVar2) {
              operator_delete((void *)local_23c8._0_8_,local_23b8[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_24d8._M_dataplus._M_p != &local_24d8.field_2) {
              operator_delete(local_24d8._M_dataplus._M_p,
                              local_24d8.field_2._M_allocated_capacity + 1);
            }
            local_23c8._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_23c8,"Not Modified","");
            (**resp->_vptr_response_writer)(resp,(string *)local_23c8);
            if ((pointer)local_23c8._0_8_ != pcVar2) {
              operator_delete((void *)local_23c8._0_8_,local_23b8[0]._M_allocated_capacity + 1);
            }
            iVar13 = 1;
          }
        }
        if (iVar13 != 0) goto LAB_0010b474;
        ppVar16 = ppVar16 + 1;
      } while (ppVar16 != ppVar3);
      iVar13 = 2;
LAB_0010b474:
      if (iVar13 != 2) goto LAB_0010b593;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_23c8);
    __f._M_fmt = "%a, %d %B %Y %H:%M:%S GMT";
    __f._M_tmb = (tm *)__tp;
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)(local_23c8 + 0x10),__f);
    local_2490._M_dataplus._M_p = (pointer)&local_2490.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2490,"last-modified","");
    std::__cxx11::stringbuf::str();
    response_writer::set_header(resp,&local_2490,(string *)local_2038);
    if ((undefined1 *)local_2038._0_8_ != local_2038 + 0x10) {
      operator_delete((void *)local_2038._0_8_,local_2038._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2490._M_dataplus._M_p != &local_2490.field_2) {
      operator_delete(local_2490._M_dataplus._M_p,local_2490.field_2._M_allocated_capacity + 1);
    }
    while ((abStack_2220[*(long *)(local_2240[0] + -0x18)] & 2) == 0) {
      lVar8 = std::istream::read((char *)local_2240,(long)local_2038);
      (*resp->_vptr_response_writer[1])(resp,local_2038,*(undefined8 *)(lVar8 + 8));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_23c8);
    std::ios_base::~ios_base(local_2348);
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_at_end(&resp->headers,
                      (resp->headers).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    resp->code = 0x194;
    local_2430._M_dataplus._M_p = (pointer)&local_2430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2430,"content-type","");
    pwVar1 = (wchar_t *)(local_2038 + 0x10);
    local_2038._0_8_ = pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"text/plain","");
    response_writer::set_header(resp,&local_2430,(string *)local_2038);
    if ((wchar_t *)local_2038._0_8_ != pwVar1) {
      operator_delete((void *)local_2038._0_8_,local_2038._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2430._M_dataplus._M_p != &local_2430.field_2) {
      operator_delete(local_2430._M_dataplus._M_p,local_2430.field_2._M_allocated_capacity + 1);
    }
    local_2038._0_8_ = pwVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,"Not Found","");
    (**resp->_vptr_response_writer)(resp,local_2038);
    if ((wchar_t *)local_2038._0_8_ != pwVar1) {
      operator_delete((void *)local_2038._0_8_,local_2038._16_8_ + 1);
    }
  }
LAB_0010b593:
  std::ifstream::~ifstream(local_2240);
  std::filesystem::__cxx11::path::~path(&local_2410);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_23e8._M_dataplus._M_p != &local_23e8.field_2) {
    operator_delete(local_23e8._M_dataplus._M_p,local_23e8.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

inline void serve_file(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);
  std::filesystem::path fspath(wpath.c_str());

  std::ifstream is(fspath, std::ios::in | std::ios::binary);
  if (is.fail()) {
    resp.clear_header();
    resp.code = 404;
    resp.set_header("content-type", "text/plain");
    resp.write("Not Found");
    return;
  }

  auto it = content_types.find(fspath.extension().string());
  if (it != content_types.end()) {
    resp.set_header("content-type", it->second);
  }

  std::uintmax_t size = std::filesystem::file_size(fspath);
  resp.set_header("content-length", std::to_string(size));

  std::filesystem::file_time_type file_time = std::filesystem::last_write_time(fspath);
  std::time_t tt = to_time_t(file_time);
  std::tm *gmt = std::gmtime(&tt);
  for (auto& h : req.headers) {
    if (h.first == "If-Modified-Since") {
      std::tm file_gmt{};
      (void) std::get_time(&file_gmt, h.second.c_str());
      if (std::mktime(&file_gmt) <= std::mktime(gmt)) {
        resp.clear_header();
        resp.code = 304;
        resp.set_header("content-type", "text/plain");
        resp.write("Not Modified");
        return;
      }
      break;
    }
  }

  std::stringstream date;
  date << std::put_time(gmt, "%a, %d %B %Y %H:%M:%S GMT");
  resp.set_header("last-modified", date.str());

  char buf[BUFSIZ];
  while (!is.eof()) {
    resp.write(buf, (size_t) is.read(buf, sizeof(buf)).gcount());
  }
}